

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O2

string * vkt::tessellation::anon_unknown_0::getProgramName
                   (string *__return_storage_ptr__,string *baseName,Winding winding,
                   bool usePointMode)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  ostringstream str;
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,(string *)baseName);
  poVar1 = std::operator<<(poVar1,"_");
  pcVar2 = (char *)0x0;
  if (winding == WINDING_CW) {
    pcVar2 = "cw";
  }
  pcVar3 = "ccw";
  if (winding != WINDING_CCW) {
    pcVar3 = pcVar2;
  }
  poVar1 = std::operator<<(poVar1,pcVar3);
  pcVar2 = "";
  if (usePointMode) {
    pcVar2 = "_point_mode";
  }
  std::operator<<(poVar1,pcVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

inline std::string getProgramName (const std::string& baseName, const Winding winding, const bool usePointMode)
{
	std::ostringstream str;
	str << baseName << "_" << getWindingShaderName(winding) << (usePointMode ? "_point_mode" : "");
	return str.str();
}